

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.c
# Opt level: O0

void Pointer_deallocate_d_(Pointer *p)

{
  Pointer *p_local;
  
  if (p == (Pointer *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer.c"
                  ,0xc4,"void Pointer_deallocate_d_(Pointer *)");
  }
  if (p->is_alias_ == 0) {
    if (p->is_using_device_ != 0) {
      if (p->d_ == (P *)0x0) {
        __assert_fail("p->d_",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer.c"
                      ,0xc9,"void Pointer_deallocate_d_(Pointer *)");
      }
      free_device_P(p->d_);
      p->d_ = (P *)0x0;
    }
    return;
  }
  __assert_fail("! p->is_alias_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer.c"
                ,0xc5,"void Pointer_deallocate_d_(Pointer *)");
}

Assistant:

void Pointer_deallocate_d_( Pointer* p )
{
  Assert( p );
  Assert( ! p->is_alias_ );

  if( p->is_using_device_ )
  {
    Assert( p->d_ );

    free_device_P( p->d_ );

    p->d_ = NULL;
  }
}